

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
csm::GeometricModel::getParameterSetIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeometricModel *this,Set pSet)

{
  int iVar1;
  uint local_38;
  Type pType;
  int i;
  undefined1 local_21;
  int local_20;
  Set local_1c;
  int NUM_PARMS;
  Set pSet_local;
  GeometricModel *this_local;
  vector<int,_std::allocator<int>_> *indices;
  
  local_1c = pSet;
  _NUM_PARMS = this;
  this_local = (GeometricModel *)__return_storage_ptr__;
  local_20 = (*(this->super_Model)._vptr_Model[0x13])();
  local_21 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)local_20);
  for (local_38 = 0; (int)local_38 < local_20; local_38 = local_38 + 1) {
    iVar1 = (*(this->super_Model)._vptr_Model[0x1b])(this,(ulong)local_38);
    if (iVar1 == 3) {
      if (local_1c != ADJUSTABLE) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict1 *)&local_38);
      }
    }
    else if ((iVar1 != 0) && (local_1c != NON_ADJUSTABLE)) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict1 *)&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GeometricModel::getParameterSetIndices(param::Set pSet) const
{
   const int NUM_PARMS = getNumParameters();
   
   std::vector<int> indices;
   indices.reserve(NUM_PARMS);
   
   for (int i = 0; i < NUM_PARMS; ++i)
   {
      param::Type pType = getParameterType(i);
      if (pType == param::FIXED)
      {
         if (pSet != param::ADJUSTABLE) indices.push_back(i);
      }
      else if ((pType != param::NONE) && (pSet != param::NON_ADJUSTABLE))
      {
         indices.push_back(i);
      }
   }
   return indices;
}